

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O3

CURLcode Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  byte *pbVar1;
  Curl_easy *pCVar2;
  byte bVar3;
  int iVar4;
  CURLcode CVar5;
  char *chlg;
  undefined7 in_register_00000031;
  
  pCVar2 = conn->data;
  iVar4 = curl_strnequal("Digest",header,6);
  if (iVar4 == 0) {
    return CURLE_BAD_CONTENT_ENCODING;
  }
  chlg = header + 6;
  bVar3 = header[6];
  while (bVar3 != 0) {
    iVar4 = Curl_isspace((uint)bVar3);
    if (iVar4 == 0) break;
    pbVar1 = (byte *)(chlg + 1);
    chlg = chlg + 1;
    bVar3 = *pbVar1;
  }
  CVar5 = Curl_auth_decode_digest_http_message
                    (chlg,(digestdata *)
                          ((long)((pCVar2->state).tempwrite + 4) +
                          (ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 6) + 8));
  return CVar5;
}

Assistant:

CURLcode Curl_input_digest(struct connectdata *conn,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  struct Curl_easy *data = conn->data;

  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISSPACE(*header))
    header++;

  return Curl_auth_decode_digest_http_message(header, digest);
}